

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

MeshPointOrigin * iDynTree::optimalcontrol::MeshPointOrigin::LastPoint(void)

{
  MeshPointOrigin *in_RDI;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"LastPoint",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"The last point",&local_4a)
  ;
  MeshPointOrigin(in_RDI,&local_28,8,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

static MeshPointOrigin LastPoint() {return MeshPointOrigin("LastPoint", 8, "The last point");}